

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void prepare_next_level(player *p)

{
  loc_conflict grid;
  _Bool daytime;
  int iVar1;
  char *pcVar2;
  chunk_conflict *pcVar3;
  chunk *pcVar4;
  byte local_121;
  byte local_f9;
  chunk *check_1;
  chunk *check;
  wchar_t min_width;
  wchar_t min_height;
  level *lev;
  chunk *old_known;
  char *known_name;
  _Bool arena;
  chunk_conflict *pcStack_c0;
  wchar_t i;
  chunk *old_level;
  char new_name [80];
  char prev_name [80];
  _Bool persist;
  player *p_local;
  
  local_f9 = 1;
  if (((p->opts).opt[0x2a] & 1U) == 0) {
    local_f9 = p->upkeep->arena_level;
  }
  prev_name[0x4f] = local_f9 & 1;
  pcVar2 = level_name(world->levels + p->last_place);
  my_strcpy(new_name + 0x48,pcVar2,0x50);
  pcVar2 = level_name(world->levels + p->place);
  my_strcpy((char *)&old_level,pcVar2,0x50);
  if ((character_dungeon & 1U) != 0) {
    if (p->cave == (chunk_conflict1 *)0x0) {
      __assert_fail("p->cave",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                    ,0x6a4,"void prepare_next_level(struct player *)");
    }
    if (prev_name[0x4f] == 0) {
      if ((cave->depth == 0) &&
         (pcVar3 = chunk_find_name(new_name + 0x48), pcVar3 == (chunk_conflict *)0x0)) {
        cave_store((chunk *)cave,new_name + 0x48,false,false);
      }
      if (cave != (chunk_conflict *)0x0) {
        cave_clear((chunk *)cave,p);
        cave = (chunk_conflict *)0x0;
      }
    }
    else if ((cave->name == (char *)0x0) || (iVar1 = strcmp(cave->name,"arena"), iVar1 != 0)) {
      compact_monsters((chunk *)cave,L'\0');
      if ((p->upkeep->arena_level & 1U) == 0) {
        grid.x = (p->grid).x;
        grid.y = (p->grid).y;
        square_set_mon((chunk *)cave,grid,L'\0');
      }
      cave_store((chunk *)cave,new_name + 0x48,false,true);
      cave_store((chunk *)p->cave,new_name + 0x48,true,true);
    }
    else if (p->place == 0) {
      p->upkeep->arena_level = false;
      if (p->last_place == 0) {
        p->last_place = p->home;
        prev_name[0x4f] = (p->opts).opt[0x2a] & 1;
      }
      player_change_place(p,(int)p->last_place);
      p->upkeep->arena_level = true;
      p->upkeep->health_who = (monster *)0x0;
      pcVar2 = level_name(world->levels + p->last_place);
      my_strcpy(new_name + 0x48,pcVar2,0x50);
      pcVar2 = level_name(world->levels + p->place);
      my_strcpy((char *)&old_level,pcVar2,0x50);
    }
  }
  if (prev_name[0x4f] == '\0') {
    cave = (chunk_conflict *)cave_generate(p,L'\0',L'\0');
    event_signal_flag(EVENT_GEN_LEVEL_END,true);
  }
  else {
    pcStack_c0 = chunk_find_name((char *)&old_level);
    if ((pcStack_c0 == (chunk_conflict *)0x0) || (pcStack_c0 == cave)) {
      if ((p->upkeep->arena_level & 1U) == 0) {
        check._4_4_ = L'\0';
        check._0_4_ = L'\0';
        _min_width = level_by_name(world,world->levels[p->place].up);
        if (_min_width != (level_conflict *)0x0) {
          pcVar2 = level_name(_min_width);
          pcVar4 = (chunk *)chunk_find_name(pcVar2);
          if (pcVar4 != (chunk *)0x0) {
            get_min_level_size(pcVar4,(int *)((long)&check + 4),(int *)&check,true);
          }
        }
        _min_width = level_by_name(world,world->levels[p->place].down);
        if (_min_width != (level_conflict *)0x0) {
          pcVar2 = level_name(_min_width);
          pcVar4 = (chunk *)chunk_find_name(pcVar2);
          if (pcVar4 != (chunk *)0x0) {
            get_min_level_size(pcVar4,(int *)((long)&check + 4),(int *)&check,false);
          }
        }
        cave = (chunk_conflict *)cave_generate(p,check._4_4_,(wchar_t)check);
        event_signal_flag(EVENT_GEN_LEVEL_END,true);
      }
      else {
        cave = (chunk_conflict *)cave_generate(p,L'\x06',L'\x06');
        event_signal_flag(EVENT_GEN_LEVEL_END,true);
      }
    }
    else {
      local_121 = 0;
      if (cave->name != (char *)0x0) {
        iVar1 = strcmp(cave->name,"arena");
        local_121 = iVar1 != 0 ^ 0xff;
      }
      known_name._3_1_ = local_121 & 1;
      pcVar2 = format("%s known",&old_level);
      old_known = (chunk *)string_make(pcVar2);
      lev = (level *)chunk_find_name((char *)old_known);
      if ((chunk_conflict1 *)lev == (chunk_conflict1 *)0x0) {
        __assert_fail("old_known",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                      ,0x6df,"void prepare_next_level(struct player *)");
      }
      cave = pcStack_c0;
      p->cave = (chunk_conflict1 *)lev;
      for (known_name._4_4_ = 0; known_name._4_4_ < (int)(uint)p->cave->obj_max;
          known_name._4_4_ = known_name._4_4_ + 1) {
        if ((cave->objects[known_name._4_4_] != (object *)0x0) &&
           (p->cave->objects[known_name._4_4_] != (object *)0x0)) {
          cave->objects[known_name._4_4_]->known = p->cave->objects[known_name._4_4_];
        }
      }
      restore_monsters();
      if ((known_name._3_1_ & 1) == 0) {
        sanitize_player_loc((chunk *)cave,p);
        player_place((chunk_conflict1 *)cave,p,p->grid);
      }
      else {
        leave_arena((chunk *)cave,p);
      }
      chunk_list_remove((char *)&old_level);
      chunk_list_remove((char *)old_known);
      string_free((char *)old_known);
    }
  }
  if ((p->depth == 0) || (p->place == 0)) {
    cave_known(p);
  }
  pcVar3 = cave;
  if (p->place == 0) {
    wiz_light((chunk *)cave,p,true);
  }
  else {
    daytime = is_daytime();
    cave_illuminate((chunk *)pcVar3,daytime);
  }
  character_dungeon = true;
  return;
}

Assistant:

void prepare_next_level(struct player *p)
{
	bool persist = OPT(p, birth_levels_persist) || p->upkeep->arena_level;
	char prev_name[80];
	char new_name[80];

	my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
			  sizeof(prev_name));
	my_strcpy(new_name, level_name(&world->levels[p->place]), sizeof(new_name));

	/* Deal with any existing current level */
	if (character_dungeon) {
		assert (p->cave);

		if (persist) {
			/* Arenas don't get stored */
			if (!cave->name || !streq(cave->name, "arena")) {
				/* Tidy up */
				compact_monsters(cave, 0);
				if (!p->upkeep->arena_level) {
					/* Leave the player marker if going to an arena */
					square_set_mon(cave, p->grid, 0);
				}

				/* Save level and known level */
				cave_store(cave, prev_name, false, true);
				cave_store(p->cave, prev_name, true, true);
			} else if (!p->place) {
				/* Paranoia - try to catch unusual exits from Arena.  Ideally
				 * unusual exits never happen and this code is unnecessary */
				p->upkeep->arena_level = false;
				if (!p->last_place) {
					p->last_place = p->home; /* paranoia */
					persist = OPT(p, birth_levels_persist);
				}
				player_change_place(p, p->last_place);
				p->upkeep->arena_level = true;

				/* Suppress "defeated" message for unusual exit */
				p->upkeep->health_who = NULL;
				my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
				  sizeof(prev_name));
				my_strcpy(new_name, level_name(&world->levels[p->place]),
						  sizeof(new_name));
			}
		} else {
			/* Save the town */
			if (!cave->depth && !chunk_find_name(prev_name)) {
				cave_store(cave, prev_name, false, false);
			}

			/* Forget knowledge of old level */
			if (cave) {
				cave_clear(cave, p);
				cave = NULL;
			}
		}
	}

	/* Prepare the new level */
	if (persist) {
		/* Persistent levels need careful work */
		struct chunk *old_level = chunk_find_name(new_name);

		/* Check all the possibilities */
		if (old_level && (old_level != cave)) {
			/* We found an old level, load the known level and assign */
			int i;
			bool arena = cave->name && streq(cave->name, "arena");
			char *known_name = string_make(format("%s known", new_name));
			struct chunk *old_known = chunk_find_name(known_name);
			assert(old_known);

			/* Assign the new ones */
			cave = old_level;
			p->cave = old_known;

			/* Associate known objects */
			for (i = 0; i < p->cave->obj_max; i++) {
				if (cave->objects[i] && p->cave->objects[i]) {
					cave->objects[i]->known = p->cave->objects[i];
				}
			}

			/* Allow monsters to recover */
			restore_monsters();

			/* Leaving arenas requires special treatment */
			if (arena) {
				leave_arena(cave, p);
			} else {
				/* Map boundary changes may not cooperate with level teleport */
				sanitize_player_loc(cave, p);

				/* Place the player */
				player_place(cave, p, p->grid);
			}

			/* Remove from the list */
			chunk_list_remove(new_name);
			chunk_list_remove(known_name);
			string_free(known_name);
		} else if (p->upkeep->arena_level) {
			/* We're creating a new arena level */
			cave = cave_generate(p, 6, 6);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		} else {
			/* Creating a new level, make sure it joins existing ones right */
			struct level *lev;
			int min_height = 0, min_width = 0;

			/* Check level above */
			lev = level_by_name(world, world->levels[p->place].up);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, true);
				}
			}

			/* Check level below */
			lev = level_by_name(world, world->levels[p->place].down);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, false);
				}
			}

			/* Generate a new level */
			cave = cave_generate(p, min_height, min_width);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		}
	} else {
		/* Just generate a new level */
		cave = cave_generate(p, 0, 0);
		event_signal_flag(EVENT_GEN_LEVEL_END, true);
	}

	/* Know the town */
	if ((!(p->depth)) || (!(p->place))) {
		cave_known(p);
	}

	/* Apply illumination */
	if (p->place) cave_illuminate(cave, is_daytime());
	else wiz_light(cave, p, true);

	/* The dungeon is ready */
	character_dungeon = true;
}